

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::setupDefaultInputs(ShaderRenderCaseInstance *this)

{
  QuadGrid *pQVar1;
  pointer pEVar2;
  uint uVar3;
  long lVar4;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar5;
  ulong uVar6;
  size_t attrNdx;
  ulong uVar7;
  
  pQVar1 = (this->m_quadGrid).
           super_UniqueBase<vkt::sr::QuadGrid,_de::DefaultDeleter<vkt::sr::QuadGrid>_>.m_data.ptr;
  addAttribute(this,0,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,pQVar1->m_numVertices,
               (pQVar1->m_positions).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  addAttribute(this,1,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,pQVar1->m_numVertices,
               (pQVar1->m_coords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  addAttribute(this,2,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,pQVar1->m_numVertices,
               (pQVar1->m_unitCoords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
  addAttribute(this,3,VK_FORMAT_R32_SFLOAT,4,pQVar1->m_numVertices,
               (pQVar1->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->m_enabledBaseAttributes).
                            super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->m_enabledBaseAttributes).
                            super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
    pvVar5 = pQVar1->m_userAttribs;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      pEVar2 = (this->m_enabledBaseAttributes).
               super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(BaseAttributeType *)((long)&setupDefaultInputs::userAttributes[0].type + lVar4) ==
          pEVar2[uVar7].type) {
        addAttribute(this,pEVar2[uVar7].location,VK_FORMAT_R32G32B32A32_SFLOAT,0x10,
                     pQVar1->m_numVertices,
                     (pvVar5->
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
      }
      pvVar5 = pvVar5 + 1;
    }
    for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
      if (setupDefaultInputs::matrices[lVar4].matrixType ==
          (this->m_enabledBaseAttributes).
          super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar7].type) {
        uVar3 = setupDefaultInputs::matrices[lVar4].numCols;
        if (setupDefaultInputs::matrices[lVar4].numCols < 1) {
          uVar3 = 0;
        }
        pvVar5 = pQVar1->m_userAttribs;
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          addAttribute(this,(this->m_enabledBaseAttributes).
                            super__Vector_base<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute,_std::allocator<vkt::sr::ShaderRenderCaseInstance::EnabledBaseAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].location + (int)uVar6,
                       VK_FORMAT_R32G32B32A32_SFLOAT,0x10,pQVar1->m_numVertices,
                       (pvVar5->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
          pvVar5 = pvVar5 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::setupDefaultInputs (void)
{
	/* Configuration of the vertex input attributes:
		a_position   is at location 0
		a_coords     is at location 1
		a_unitCoords is at location 2
		a_one        is at location 3

	  User attributes starts from at the location 4.
	*/

	DE_ASSERT(m_quadGrid);
	const QuadGrid&		quadGrid	= *m_quadGrid;

	addAttribute(0u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getPositions());
	addAttribute(1u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getCoords());
	addAttribute(2u, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getUnitCoords());
	addAttribute(3u, VK_FORMAT_R32_SFLOAT, sizeof(float), quadGrid.getNumVertices(), quadGrid.getAttribOne());

	static const struct
	{
		BaseAttributeType	type;
		int					userNdx;
	} userAttributes[] =
	{
		{ A_IN0, 0 },
		{ A_IN1, 1 },
		{ A_IN2, 2 },
		{ A_IN3, 3 }
	};

	static const struct
	{
		BaseAttributeType	matrixType;
		int					numCols;
		int					numRows;
	} matrices[] =
	{
		{ MAT2,		2, 2 },
		{ MAT2x3,	2, 3 },
		{ MAT2x4,	2, 4 },
		{ MAT3x2,	3, 2 },
		{ MAT3,		3, 3 },
		{ MAT3x4,	3, 4 },
		{ MAT4x2,	4, 2 },
		{ MAT4x3,	4, 3 },
		{ MAT4,		4, 4 }
	};

	for (size_t attrNdx = 0; attrNdx < m_enabledBaseAttributes.size(); attrNdx++)
	{
		for (int userNdx = 0; userNdx < DE_LENGTH_OF_ARRAY(userAttributes); userNdx++)
		{
			if (userAttributes[userNdx].type != m_enabledBaseAttributes[attrNdx].type)
				continue;

			addAttribute(m_enabledBaseAttributes[attrNdx].location, VK_FORMAT_R32G32B32A32_SFLOAT, sizeof(tcu::Vec4), quadGrid.getNumVertices(), quadGrid.getUserAttrib(userNdx));
		}

		for (int matNdx = 0; matNdx < DE_LENGTH_OF_ARRAY(matrices); matNdx++)
		{

			if (matrices[matNdx].matrixType != m_enabledBaseAttributes[attrNdx].type)
				continue;

			const int numCols = matrices[matNdx].numCols;

			for (int colNdx = 0; colNdx < numCols; colNdx++)
			{
				addAttribute(m_enabledBaseAttributes[attrNdx].location + colNdx, VK_FORMAT_R32G32B32A32_SFLOAT, (deUint32)(4 * sizeof(float)), quadGrid.getNumVertices(), quadGrid.getUserAttrib(colNdx));
			}
		}
	}
}